

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_pointer
               (sqlite3_context *pCtx,void *pPtr,char *zPType,_func_void_void_ptr *xDestructor)

{
  Mem *p;
  Mem *pOut;
  _func_void_void_ptr *xDestructor_local;
  char *zPType_local;
  void *pPtr_local;
  sqlite3_context *pCtx_local;
  
  p = pCtx->pOut;
  sqlite3VdbeMemRelease(p);
  p->flags = 1;
  sqlite3VdbeMemSetPointer(p,pPtr,zPType,xDestructor);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_pointer(
  sqlite3_context *pCtx,
  void *pPtr,
  const char *zPType,
  void (*xDestructor)(void*)
){
  Mem *pOut;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(pPtr, xDestructor, 0);
    return;
  }
#endif
  pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  sqlite3VdbeMemRelease(pOut);
  pOut->flags = MEM_Null;
  sqlite3VdbeMemSetPointer(pOut, pPtr, zPType, xDestructor);
}